

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O1

int AF_AActor_A_FreezeDeath
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  AActor *ent;
  player_t *ppVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  undefined4 extraout_var_00;
  char *__assertion;
  bool bVar8;
  FSoundID local_24;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      ent = (AActor *)(param->field_0).field_1.a;
      if (ent != (AActor *)0x0) {
        if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar7 = (ent->super_DThinker).super_DObject.Class;
        bVar8 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar3 && bVar8) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar8 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004b4091;
        }
      }
      uVar5 = FRandom::GenRand32(&pr_freezedeath);
      uVar6 = FRandom::GenRand32(&pr_freezedeath);
      ent->tics = (uVar6 & 0xff) + (uVar5 & 0xff) + 0x4b;
      (ent->flags).Value = (ent->flags).Value | 0x80080006;
      (ent->flags2).Value = (ent->flags2).Value | 0x41600;
      pbVar1 = (byte *)((long)&(ent->flags3).Value + 2);
      *pbVar1 = *pbVar1 | 0x20;
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
      }
      ent->Height = *(double *)(((ent->super_DThinker).super_DObject.Class)->Defaults + 0x180);
      if (((ent->RenderStyle).field_0.BlendOp & 0xfc) == 4) {
        ent->RenderStyle = LegacyRenderStyles[1];
      }
      S_FindSound("misc/freeze");
      S_Sound(ent,4,&local_24,1.0,1.0);
      if (((ent->flags).Value & 0x40000000) != 0) {
        ent->Alpha = 1.0;
        ent->visdir = '\0';
      }
      ppVar2 = ent->player;
      if (ppVar2 == (player_t *)0x0) {
        if ((((ent->flags3).Value & 0x2000) != 0) && (ent->special != 0)) {
          P_ExecuteSpecial(ent->special,(line_t *)0x0,ent,false,ent->args[0],ent->args[1],
                           ent->args[2],ent->args[3],ent->args[4]);
          ent->special = 0;
        }
      }
      else {
        ppVar2->damagecount = 0;
        ppVar2->bonuscount = 0;
        ppVar2->poisoncount = 0;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004b4091:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x55,
                "int AF_AActor_A_FreezeDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeath)
{
	PARAM_SELF_PROLOGUE(AActor);

	int t = pr_freezedeath();
	self->tics = 75+t+pr_freezedeath();
	self->flags |= MF_SOLID|MF_SHOOTABLE|MF_NOBLOOD|MF_ICECORPSE;
	self->flags2 |= MF2_PUSHABLE|MF2_TELESTOMP|MF2_PASSMOBJ|MF2_SLIDE;
	self->flags3 |= MF3_CRASHED;
	self->Height = self->GetDefault()->Height;
	// Remove fuzz effects from frozen actors.
	if (self->RenderStyle.BlendOp >= STYLEOP_Fuzz && self->RenderStyle.BlendOp <= STYLEOP_FuzzOrRevSub)
	{
		self->RenderStyle = STYLE_Normal;
	}

	S_Sound (self, CHAN_BODY, "misc/freeze", 1, ATTN_NORM);

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1;
		self->visdir = 0;
	}

	if (self->player)
	{
		self->player->damagecount = 0;
		self->player->poisoncount = 0;
		self->player->bonuscount = 0;
	}
	else if (self->flags3 & MF3_ISMONSTER && self->special)
	{ // Initiate monster death actions
		P_ExecuteSpecial(self->special, NULL, self, false, self->args[0],
			self->args[1], self->args[2], self->args[3], self->args[4]);
		self->special = 0;
	}
	return 0;
}